

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Layout.h
# Opt level: O2

void __thiscall
Iir::LayoutBase::addPoleZeroConjugatePairs(LayoutBase *this,complex_t *pole,complex_t *zero)

{
  undefined8 uVar1;
  ulong uVar2;
  PoleZeroPair *pPVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  int iVar7;
  double dVar8;
  double dVar9;
  
  if ((this->m_numPoles & 1) != 0) {
    throw_invalid_argument("Can\'t add 2nd order after a 1st order filter.");
  }
  if ((NAN(*(double *)pole->_M_value)) || (NAN(*(double *)(pole->_M_value + 8)))) {
    throw_invalid_argument("Pole to add is NaN.");
  }
  dVar8 = *(double *)zero->_M_value;
  if ((NAN(dVar8)) || (dVar9 = *(double *)(zero->_M_value + 8), NAN(dVar9))) {
    throw_invalid_argument("Zero to add is NaN.");
    dVar8 = *(double *)zero->_M_value;
    dVar9 = *(double *)(zero->_M_value + 8);
  }
  uVar1 = *(undefined8 *)pole->_M_value;
  uVar2 = *(ulong *)(pole->_M_value + 8);
  uVar4 = *(undefined8 *)zero->_M_value;
  uVar5 = *(undefined8 *)(zero->_M_value + 8);
  pPVar3 = this->m_pair;
  iVar7 = this->m_numPoles / 2;
  uVar6 = *(undefined8 *)(pole->_M_value + 8);
  *(undefined8 *)pPVar3[iVar7].poles.super_complex_pair_t.first._M_value =
       *(undefined8 *)pole->_M_value;
  *(undefined8 *)(pPVar3[iVar7].poles.super_complex_pair_t.first._M_value + 8) = uVar6;
  *(undefined8 *)pPVar3[iVar7].poles.super_complex_pair_t.second._M_value = uVar1;
  *(ulong *)(pPVar3[iVar7].poles.super_complex_pair_t.second._M_value + 8) =
       uVar2 ^ 0x8000000000000000;
  *(undefined8 *)pPVar3[iVar7].zeros.super_complex_pair_t.first._M_value = uVar4;
  *(undefined8 *)(pPVar3[iVar7].zeros.super_complex_pair_t.first._M_value + 8) = uVar5;
  *(double *)pPVar3[iVar7].zeros.super_complex_pair_t.second._M_value = dVar8;
  *(double *)(pPVar3[iVar7].zeros.super_complex_pair_t.second._M_value + 8) = -dVar9;
  this->m_numPoles = this->m_numPoles + 2;
  return;
}

Assistant:

void addPoleZeroConjugatePairs (const complex_t& pole,
						const complex_t& zero)
		{
			if (m_numPoles&1)
				throw_invalid_argument(errCantAdd2ndOrder);
			if (Iir::is_nan(pole))
				throw_invalid_argument(errPoleisNaN);
			if (Iir::is_nan(zero))
				throw_invalid_argument(errZeroisNaN);
			m_pair[m_numPoles/2] = PoleZeroPair (
				pole, zero, std::conj (pole), std::conj (zero));
			m_numPoles += 2;
		}